

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O1

void com_mc_affine(com_core_t *core,pel *pred_buf)

{
  pthread_mutex_t *ppVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  com_pic_t *pcVar7;
  com_seqh_t *pcVar8;
  com_pic_t *pcVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  s32 (*paasVar21) [1024] [2];
  int iVar22;
  long lVar23;
  pel *ppVar24;
  long lVar25;
  pel *ppVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  s32 (*paasVar33) [1024] [2];
  int iVar34;
  pel pred_snd [24576];
  int local_6178;
  pel *local_6170;
  uint local_6164;
  uint local_6160;
  pel *local_6148;
  int local_6130;
  int local_60c0;
  pel local_6060 [24624];
  
  bVar2 = core->refi[0];
  if ((char)bVar2 < '\0') {
    local_6164 = 0;
  }
  else {
    local_6164 = (uint)(-1 < core->refi[1]);
  }
  iVar3 = core->cu_pix_x;
  iVar4 = core->cu_width;
  iVar5 = core->cu_height;
  lVar23 = 8;
  iVar19 = 0;
  if ((core->pichdr->affine_subblock_size_idx == 1) || ((-1 < (char)bVar2 && (-1 < core->refi[1]))))
  {
    bVar10 = false;
  }
  else {
    lVar23 = 4;
    bVar10 = true;
  }
  pcVar7 = core->pic;
  iVar6 = core->cu_pix_y;
  uVar14 = (uint)(bVar2 >> 7);
  iVar11 = iVar5 * iVar4;
  iVar22 = (int)lVar23;
  lVar27 = (long)g_tbl_log2[lVar23];
  local_6160 = uVar14;
  do {
    local_6148 = pred_buf;
    if (iVar19 != 0) {
      local_6148 = local_6060;
    }
    iVar13 = iVar4;
    if ((iVar19 == 0 && local_6164 == 0) && (local_6148 = pred_buf, *(int *)core->cbfy == 0)) {
      iVar13 = pcVar7->stride_luma;
      local_6148 = pcVar7->y + (long)iVar3 + (long)(iVar13 * iVar6);
    }
    pcVar8 = core->seqhdr;
    iVar18 = pcVar8->bit_depth_internal;
    if (0 < iVar5) {
      uVar20 = (ulong)local_6160;
      pcVar9 = core->refp[core->refi[uVar20]][uVar20].pic;
      iVar32 = pcVar8->pic_width + 4;
      iVar12 = pcVar8->pic_height + 4;
      iVar15 = pcVar9->stride_luma;
      paasVar21 = core->affine_sb_mv + uVar20;
      ppVar1 = &pcVar9->mutex;
      iVar16 = 0;
      do {
        if (0 < iVar4) {
          lVar25 = 0;
          do {
            uVar30 = (*paasVar21)[0][0];
            uVar29 = (*paasVar21)[0][1];
            iVar28 = (int)((iVar3 + (int)lVar25) * 0x10 + uVar30) >> 4;
            iVar34 = (int)(uVar29 + (iVar16 + iVar6) * 0x10) >> 4;
            if (iVar32 <= iVar28) {
              iVar28 = iVar32;
            }
            if (iVar28 < -0x83) {
              iVar28 = -0x84;
            }
            if (iVar12 <= iVar34) {
              iVar34 = iVar12;
            }
            if (iVar34 < -0x83) {
              iVar34 = -0x84;
            }
            iVar17 = iVar22 + 4 + iVar34;
            if (pcVar9->finished_line < iVar17) {
              pthread_mutex_lock((pthread_mutex_t *)ppVar1);
              while (pcVar9->finished_line < iVar17) {
                pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
              }
              pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
            }
            ppVar26 = local_6148 + lVar25;
            uVar30 = uVar30 & 0xf;
            uVar29 = uVar29 & 0xf;
            ppVar24 = pcVar9->y + (long)iVar28 + (long)(iVar34 * iVar15);
            if (uVar29 == 0 && uVar30 == 0) {
              (*uavs3d_funs_handle.ipcpy[lVar27 + -2])(ppVar24,iVar15,ppVar26,iVar13,iVar22,iVar22);
            }
            else if (uVar29 == 0) {
              (*uavs3d_funs_handle.ipcpy[lVar27 + 4])(ppVar24,iVar15,ppVar26,iVar13,iVar22,iVar22);
            }
            else if (uVar30 == 0) {
              (*uavs3d_funs_handle.ipflt[1][lVar27 + 4])
                        (ppVar24,iVar15,ppVar26,iVar13,iVar22,iVar22,
                         g_tbl_mc_coeff_luma_hp[0] + (uVar29 << 3),~(-1 << ((byte)iVar18 & 0x1f)));
            }
            else {
              (*(*(_func_void_pel_ptr_int_pel_ptr_int_int_int_s8_ptr_int *(*) [6])
                  (uavs3d_funs_handle.ipflt_ext + -1))[lVar27 + 4])
                        (ppVar24,iVar15,ppVar26,iVar13,iVar22,iVar22,g_tbl_mc_coeff_luma_hp[uVar30],
                         uVar29 * 8 + 0x15ed40);
            }
            lVar25 = lVar25 + lVar23;
            paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 1);
          } while ((int)lVar25 < iVar4);
        }
        local_6148 = local_6148 + iVar13 * iVar22;
        iVar16 = iVar16 + iVar22;
      } while (iVar16 < iVar5);
    }
    iVar19 = iVar19 + 1;
    local_6160 = (uint)(local_6160 == 0);
  } while (iVar19 != local_6164 + 1);
  local_60c0 = 1;
  if ((char)local_6164 != '\0') {
    ppVar26 = pred_buf;
    iVar19 = iVar4;
    if (*(int *)core->cbfy == 0) {
      iVar19 = pcVar7->stride_luma;
      ppVar26 = pcVar7->y + (long)iVar3 + (long)(iVar19 * iVar6);
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar26,iVar19,pred_buf,local_6060,iVar4,iVar5);
    local_60c0 = 2;
  }
  iVar19 = 0;
  do {
    local_6170 = pred_buf + iVar11;
    if (iVar19 != 0) {
      local_6170 = local_6060;
    }
    local_6178 = iVar4;
    if ((iVar19 == 0 && local_6164 == 0) &&
       (local_6170 = pred_buf + iVar11, *(short *)core->cbfc == 0)) {
      local_6178 = pcVar7->stride_chroma;
      local_6170 = pcVar7->uv + (long)iVar3 + (long)(local_6178 * (iVar6 / 2));
    }
    pcVar9 = core->refp[core->refi[uVar14]][uVar14].pic;
    paasVar21 = core->affine_sb_mv + uVar14;
    pcVar8 = core->seqhdr;
    uVar30 = ~(-1 << ((byte)pcVar8->bit_depth_internal & 0x1f));
    iVar18 = pcVar8->pic_width + 4 >> 1;
    iVar13 = pcVar8->pic_height + 4 >> 1;
    iVar22 = pcVar9->stride_chroma;
    if (bVar10) {
      if (0 < iVar5) {
        ppVar1 = &pcVar9->mutex;
        iVar15 = 0;
        paasVar33 = paasVar21;
        do {
          paasVar33 = (s32 (*) [1024] [2])(*paasVar33 + (iVar4 >> 2));
          if (0 < iVar4) {
            lVar23 = 0;
            do {
              uVar29 = ((*paasVar33)[1][1] +
                        (*paasVar21)[0][1] + (*paasVar21)[1][1] + (*paasVar33)[0][1] + 2 >> 2) +
                       (iVar6 + iVar15) * 0x10;
              uVar31 = (iVar3 + (int)lVar23) * 0x10 +
                       ((*paasVar21)[0][0] + (*paasVar21)[1][0] + (*paasVar33)[0][0] +
                        (*paasVar33)[1][0] + 2 >> 2);
              iVar12 = (int)uVar31 >> 5;
              iVar16 = (int)uVar29 >> 5;
              if (iVar18 <= iVar12) {
                iVar12 = iVar18;
              }
              iVar32 = iVar12 * 2;
              if (iVar12 < -0x42) {
                iVar32 = -0x84;
              }
              if (iVar13 <= iVar16) {
                iVar16 = iVar13;
              }
              if (iVar16 < -0x41) {
                iVar16 = -0x42;
              }
              iVar12 = iVar16 * 2 + 0xc;
              if (pcVar9->finished_line < iVar12) {
                pthread_mutex_lock((pthread_mutex_t *)ppVar1);
                while (pcVar9->finished_line < iVar12) {
                  pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
                }
                pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
              }
              ppVar26 = local_6170 + lVar23;
              uVar31 = uVar31 & 0x1f;
              uVar29 = uVar29 & 0x1f;
              ppVar24 = pcVar9->uv + (long)iVar32 + (long)(iVar16 * iVar22);
              if (uVar29 == 0 && uVar31 == 0) {
                (*uavs3d_funs_handle.ipcpy[1])(ppVar24,iVar22,ppVar26,local_6178,8,4);
              }
              else if (uVar29 == 0) {
                (*uavs3d_funs_handle.ipflt[1][1])
                          (ppVar24,iVar22,ppVar26,local_6178,8,4,
                           g_tbl_mc_coeff_chroma_hp[0] + (uVar31 << 2),uVar30);
              }
              else if (uVar31 == 0) {
                (*uavs3d_funs_handle.ipflt[3][1])
                          (ppVar24,iVar22,ppVar26,local_6178,8,4,
                           g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),uVar30);
              }
              else {
                (*uavs3d_funs_handle.ipflt_ext[1][1])
                          (ppVar24,iVar22,ppVar26,local_6178,8,4,g_tbl_mc_coeff_chroma_hp[uVar31],
                           g_tbl_mc_coeff_chroma_hp[uVar29],uVar30);
              }
              lVar23 = lVar23 + 8;
              paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 2);
              paasVar33 = (s32 (*) [1024] [2])(*paasVar33 + 2);
            } while ((int)lVar23 < iVar4);
          }
          local_6170 = local_6170 + local_6178 * 4;
          paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + (iVar4 >> 2));
          iVar15 = iVar15 + 8;
        } while (iVar15 < iVar5);
      }
    }
    else if (0 < iVar5) {
      ppVar1 = &pcVar9->mutex;
      iVar15 = 0;
      do {
        if (0 < iVar4) {
          lVar23 = 0;
          do {
            uVar31 = (iVar3 + (int)lVar23) * 0x10 + (*paasVar21)[0][0];
            uVar29 = (*paasVar21)[0][1] + (iVar15 + iVar6) * 0x10;
            iVar12 = (int)uVar31 >> 5;
            iVar16 = (int)uVar29 >> 5;
            if (iVar18 <= iVar12) {
              iVar12 = iVar18;
            }
            iVar32 = iVar12 * 2;
            if (iVar12 < -0x42) {
              iVar32 = -0x84;
            }
            if (iVar13 <= iVar16) {
              iVar16 = iVar13;
            }
            if (iVar16 < -0x41) {
              iVar16 = -0x42;
            }
            iVar12 = iVar16 * 2 + 0xc;
            if (pcVar9->finished_line < iVar12) {
              pthread_mutex_lock((pthread_mutex_t *)ppVar1);
              iVar28 = pcVar9->finished_line;
              while (iVar28 < iVar12) {
                pthread_cond_wait((pthread_cond_t *)&pcVar9->cond,(pthread_mutex_t *)ppVar1);
                iVar28 = pcVar9->finished_line;
              }
              pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
            }
            ppVar26 = local_6170 + lVar23;
            uVar31 = uVar31 & 0x1f;
            uVar29 = uVar29 & 0x1f;
            ppVar24 = pcVar9->uv + (long)iVar32 + (long)(iVar16 * iVar22);
            if (uVar29 == 0 && uVar31 == 0) {
              (*uavs3d_funs_handle.ipcpy[1])(ppVar24,iVar22,ppVar26,local_6178,8,4);
            }
            else if (uVar29 == 0) {
              (*uavs3d_funs_handle.ipflt[1][1])
                        (ppVar24,iVar22,ppVar26,local_6178,8,4,
                         g_tbl_mc_coeff_chroma_hp[0] + (uVar31 << 2),uVar30);
            }
            else if (uVar31 == 0) {
              (*uavs3d_funs_handle.ipflt[3][1])
                        (ppVar24,iVar22,ppVar26,local_6178,8,4,
                         g_tbl_mc_coeff_chroma_hp[0] + (uVar29 << 2),uVar30);
            }
            else {
              (*uavs3d_funs_handle.ipflt_ext[1][1])
                        (ppVar24,iVar22,ppVar26,local_6178,8,4,g_tbl_mc_coeff_chroma_hp[uVar31],
                         g_tbl_mc_coeff_chroma_hp[uVar29],uVar30);
            }
            lVar23 = lVar23 + 8;
            paasVar21 = (s32 (*) [1024] [2])(*paasVar21 + 1);
          } while ((int)lVar23 < iVar4);
        }
        local_6170 = local_6170 + local_6178 * 4;
        iVar15 = iVar15 + 8;
      } while (iVar15 < iVar5);
    }
    iVar19 = iVar19 + 1;
    uVar14 = (uint)(uVar14 == 0);
  } while (iVar19 != local_60c0);
  if ((char)local_6164 != '\0') {
    ppVar26 = pred_buf;
    iVar19 = iVar4;
    local_6130 = iVar11;
    if (*(short *)core->cbfc == 0) {
      iVar19 = pcVar7->stride_chroma;
      ppVar26 = pcVar7->uv + (iVar6 / 2) * iVar19;
      local_6130 = iVar3;
    }
    (*uavs3d_funs_handle.avg_pel[(long)core->cu_log2w + -2])
              (ppVar26 + local_6130,iVar19,pred_buf + iVar11,local_6060,iVar4,iVar5 >> 1);
  }
  return;
}

Assistant:

void com_mc_affine(com_core_t *core, pel *pred_buf)
{
    com_pic_t *pic = core->pic;
    int x = core->cu_pix_x;
    int y = core->cu_pix_y;
    int cu_width = core->cu_width;
    int cu_height = core->cu_height;
    com_ref_pic_t(*refp)[REFP_NUM] = core->refp;
    s8 *refi = core->refi;
    com_pic_t *ref_pic;
    ALIGNED_32(pel pred_snd[MAX_CU_DIM + MAX_CU_DIM / 2]);
    int sub_blk_size;
    int bi = REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]);
    int lidx, lidx_base = REFI_IS_VALID(refi[REFP_0]) ? REFP_0 : REFP_1;
    pel *dstl, *dstc;
    int i_dstl, i_dstc;
    int blk_dim = cu_width * cu_height;

    if (core->pichdr->affine_subblock_size_idx == 1 || (REFI_IS_VALID(refi[REFP_0]) && REFI_IS_VALID(refi[REFP_1]))) {
        sub_blk_size = 8;
    } else {
        sub_blk_size = 4;
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstl = cu_width;
            dstl = pred_snd;
        } else if (!bi && !M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        com_affine_mc_luma(core, dstl, i_dstl, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M32(core->cbfy)) {
            i_dstl = pic->stride_luma;
            dstl = pic->y + y * i_dstl + x;
        } else {
            i_dstl = cu_width;
            dstl = pred_buf;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstl, i_dstl, pred_buf, pred_snd, cu_width, cu_height);
    }

    lidx = lidx_base;

    for (int i = 0; i <= bi; i++) {
        ref_pic = refp[refi[lidx]][lidx].pic;

        if (i) {
            i_dstc = cu_width;
            dstc = pred_snd;
        } else if (!bi && !M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        com_affine_mc_chroma(core, dstc, i_dstc, x, y, cu_width, cu_height, ref_pic, sub_blk_size, lidx);
        lidx = !lidx;
    }
    if (bi) {
        if (!M16(core->cbfc)) {
            i_dstc = pic->stride_chroma;
            dstc = pic->uv + y / 2 * i_dstc + x;
        } else {
            i_dstc = cu_width;
            dstc = pred_buf + blk_dim;
        }
        uavs3d_funs_handle.avg_pel[core->cu_log2w - 2](dstc, i_dstc, pred_buf + blk_dim, pred_snd, cu_width, cu_height >> 1);
    }
}